

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool IsLegalOpcodeForPathDepBrFold(Instr *instr)

{
  OpCode OVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  Instr *instr_local;
  
  bVar2 = IR::Instr::IsRealInstr(instr);
  if (bVar2) {
    OVar1 = instr->m_opcode;
    if ((((OVar1 == Ld_A) || (OVar1 == LdFld)) || (OVar1 == Ld_I4)) ||
       ((OVar1 == ByteCodeUses || (OVar1 == InlineeEnd)))) {
      instr_local._7_1_ = true;
    }
    else {
      sourceContextId = Func::GetSourceContextId(instr->m_func);
      functionId = Func::GetLocalFunctionId(instr->m_func);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01ec1678,PathDepBranchFoldingPhase,sourceContextId,
                         functionId);
      if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
        Output::Print(L"Skipping PathDependentBranchFolding due to: ");
        IR::Instr::Dump(instr);
      }
      instr_local._7_1_ = false;
    }
  }
  else {
    instr_local._7_1_ = true;
  }
  return instr_local._7_1_;
}

Assistant:

static bool IsLegalOpcodeForPathDepBrFold(IR::Instr *instr)
{
    if (!instr->IsRealInstr())
    {
        return true;
    }
    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::LdFld:
    case Js::OpCode::ByteCodeUses:
    case Js::OpCode::InlineeEnd:
        return true;
    }
#if DBG
    if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, instr->m_func) && Js::Configuration::Global.flags.Verbose)
    {
        Output::Print(_u("Skipping PathDependentBranchFolding due to: "));
        instr->Dump();
    }
#endif
    return false;
}